

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QTC.cc
# Opt level: O3

void QTC::TC_real(char *scope,char *ccase,int n)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  int iVar3;
  iterator iVar4;
  mapped_type_conflict1 *pmVar5;
  const_iterator cVar6;
  FILE *__stream;
  mapped_type_conflict1 mVar7;
  string value;
  string filename;
  allocator<char> local_79;
  key_type local_78;
  string local_50;
  
  if (TC_real(char_const*,char_const*,int)::active_abi_cxx11_ == '\0') {
    TC_real();
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,scope,(allocator<char> *)&local_50);
  iVar4 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
          ::find(&TC_real(char_const*,char_const*,int)::active_abi_cxx11_._M_t,&local_78.first);
  paVar1 = &local_78.first.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_78.first._M_dataplus._M_p,
                    CONCAT71(local_78.first.field_2._M_allocated_capacity._1_7_,
                             local_78.first.field_2._M_local_buf[0]) + 1);
  }
  if ((_Rb_tree_header *)iVar4._M_node ==
      &TC_real(char_const*,char_const*,int)::active_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) {
    local_78.first._M_string_length = 0;
    local_78.first.field_2._M_local_buf[0] = '\0';
    local_50.field_2._M_allocated_capacity = 0x45504f43535f4354;
    local_50._M_string_length = 8;
    local_50.field_2._M_local_buf[8] = '\0';
    local_78.first._M_dataplus._M_p = (pointer)paVar1;
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    bVar2 = QUtil::get_env(&local_50,&local_78.first);
    if (bVar2) {
      iVar3 = std::__cxx11::string::compare((char *)&local_78);
      mVar7 = iVar3 == 0;
    }
    else {
      mVar7 = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78.first._M_dataplus._M_p != paVar1) {
      operator_delete(local_78.first._M_dataplus._M_p,
                      CONCAT71(local_78.first.field_2._M_allocated_capacity._1_7_,
                               local_78.first.field_2._M_local_buf[0]) + 1);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_78,scope,(allocator<char> *)&local_50);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
             ::operator[](&TC_real(char_const*,char_const*,int)::active_abi_cxx11_,&local_78.first);
    *pmVar5 = mVar7;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78.first._M_dataplus._M_p != paVar1) {
      operator_delete(local_78.first._M_dataplus._M_p,
                      CONCAT71(local_78.first.field_2._M_allocated_capacity._1_7_,
                               local_78.first.field_2._M_local_buf[0]) + 1);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_78,scope,(allocator<char> *)&local_50);
    iVar4 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
            ::find(&TC_real(char_const*,char_const*,int)::active_abi_cxx11_._M_t,&local_78.first);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78.first._M_dataplus._M_p != paVar1) {
      operator_delete(local_78.first._M_dataplus._M_p,
                      CONCAT71(local_78.first.field_2._M_allocated_capacity._1_7_,
                               local_78.first.field_2._M_local_buf[0]) + 1);
    }
  }
  if ((char)iVar4._M_node[2]._M_color == _S_black) {
    if (TC_real(char_const*,char_const*,int)::cache_abi_cxx11_ == '\0') {
      TC_real();
    }
    local_50._M_string_length = 0;
    local_50.field_2._M_allocated_capacity =
         local_50.field_2._M_allocated_capacity & 0xffffffffffffff00;
    local_78.first._M_dataplus._M_p = (pointer)paVar1;
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"TC_FILENAME","");
    bVar2 = QUtil::get_env(&local_78.first,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78.first._M_dataplus._M_p != paVar1) {
      operator_delete(local_78.first._M_dataplus._M_p,
                      CONCAT71(local_78.first.field_2._M_allocated_capacity._1_7_,
                               local_78.first.field_2._M_local_buf[0]) + 1);
    }
    if (bVar2) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,ccase,&local_79);
      local_78.second = n;
      cVar6 = std::
              _Rb_tree<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Identity<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
              ::find(&TC_real(char_const*,char_const*,int)::cache_abi_cxx11_._M_t,&local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78.first._M_dataplus._M_p != paVar1) {
        operator_delete(local_78.first._M_dataplus._M_p,
                        CONCAT71(local_78.first.field_2._M_allocated_capacity._1_7_,
                                 local_78.first.field_2._M_local_buf[0]) + 1);
      }
      if ((_Rb_tree_header *)cVar6._M_node ==
          &TC_real(char_const*,char_const*,int)::cache_abi_cxx11_._M_t._M_impl.super__Rb_tree_header
         ) {
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,ccase,&local_79);
        local_78.second = n;
        std::
        _Rb_tree<std::pair<std::__cxx11::string,int>,std::pair<std::__cxx11::string,int>,std::_Identity<std::pair<std::__cxx11::string,int>>,std::less<std::pair<std::__cxx11::string,int>>,std::allocator<std::pair<std::__cxx11::string,int>>>
        ::_M_insert_unique<std::pair<std::__cxx11::string,int>>
                  ((_Rb_tree<std::pair<std::__cxx11::string,int>,std::pair<std::__cxx11::string,int>,std::_Identity<std::pair<std::__cxx11::string,int>>,std::less<std::pair<std::__cxx11::string,int>>,std::allocator<std::pair<std::__cxx11::string,int>>>
                    *)&TC_real(char_const*,char_const*,int)::cache_abi_cxx11_,&local_78);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78.first._M_dataplus._M_p != paVar1) {
          operator_delete(local_78.first._M_dataplus._M_p,
                          CONCAT71(local_78.first.field_2._M_allocated_capacity._1_7_,
                                   local_78.first.field_2._M_local_buf[0]) + 1);
        }
        __stream = (FILE *)QUtil::safe_fopen(local_50._M_dataplus._M_p,"ab");
        fprintf(__stream,"%s %d\n",ccase,(ulong)(uint)n);
        fclose(__stream);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void
QTC::TC_real(char const* const scope, char const* const ccase, int n)
{
    static std::map<std::string, bool> active;
    auto is_active = active.find(scope);
    if (is_active == active.end()) {
        active[scope] = tc_active(scope);
        is_active = active.find(scope);
    }

    if (!is_active->second) {
        return;
    }

    static std::set<std::pair<std::string, int>> cache;

    std::string filename;
#ifdef _WIN32
# define TC_ENV "TC_WIN_FILENAME"
#else
# define TC_ENV "TC_FILENAME"
#endif
    if (!QUtil::get_env(TC_ENV, &filename)) {
        return;
    }
#undef TC_ENV

    if (cache.count(std::make_pair(ccase, n))) {
        return;
    }
    cache.insert(std::make_pair(ccase, n));

    FILE* tc = QUtil::safe_fopen(filename.c_str(), "ab");
    fprintf(tc, "%s %d\n", ccase, n);
    fclose(tc);
}